

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

ssize_t __thiscall
vm_httpreq_cookie::send(vm_httpreq_cookie *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t sVar1;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  ulong uVar2;
  undefined4 in_register_00000034;
  TadsServerThread *this_00;
  
  this_00 = (TadsServerThread *)CONCAT44(in_register_00000034,__fd);
  sVar1 = TadsServerThread::send(this_00,0x2b4bda,__buf,__n,__flags);
  uVar2 = 0;
  if ((int)sVar1 != 0) {
    sVar1 = TadsServerThread::send(this_00,(int)this->name,__buf_00,__n,__flags);
    if ((int)sVar1 != 0) {
      sVar1 = TadsServerThread::send(this_00,0x2e1b26,__buf_01,__n,__flags);
      if ((int)sVar1 != 0) {
        sVar1 = TadsServerThread::send(this_00,(int)this->val,__buf_02,__n,__flags);
        uVar2 = 0;
        if ((int)sVar1 != 0) {
          sVar1 = TadsServerThread::send(this_00,0x2b4d59,__buf_03,__n,__flags);
          uVar2 = (ulong)((int)sVar1 != 0);
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int vm_httpreq_cookie::send(TadsServerThread *t)
{
    /* send the Set-Cookie header */
    return (t->send("Set-Cookie: ")
            && t->send(name)
            && t->send("=")
            && t->send(val)
            && t->send("\r\n"));
}